

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *zlibsettings;
  LodePNGColorMode *color_00;
  LodePNGInfo *info;
  LodePNGColorMode *dest;
  LodePNGColorType LVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var5;
  long lVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  size_t sVar11;
  uchar uVar12;
  ushort uVar13;
  uint uVar14;
  int iVar15;
  byte *pbVar16;
  uchar *puVar17;
  uchar *puVar18;
  size_t sVar19;
  uchar *puVar20;
  size_t sVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  size_t bytewidth;
  uint *chunk;
  uint uVar32;
  size_t newsize;
  uint *data;
  size_t __size;
  ulong local_2c0;
  LodePNGColorMode *color;
  uchar *local_268;
  size_t sStack_260;
  size_t local_258;
  size_t *local_248;
  uchar **local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  uVar14 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar14;
  if (uVar14 != 0) {
    return uVar14;
  }
  lVar27 = (ulong)*h * (ulong)*w;
  uVar14 = (uint)lVar27;
  if (*h == 0) {
    if (0xfffffff < uVar14) goto LAB_0010c289;
  }
  else if ((int)((ulong)lVar27 >> 0x20) != 0 || 0xfffffff < uVar14) {
LAB_0010c289:
    state->error = 0x5c;
    return 0x5c;
  }
  chunk = (uint *)(in + 0x21);
  color_00 = &(state->info_png).color;
  info = &state->info_png;
  zlibsettings = &state->decoder;
  local_240 = (state->info_png).unknown_chunks_data;
  local_248 = (state->info_png).unknown_chunks_size;
  bVar10 = false;
  iVar15 = 1;
  uVar28 = 0;
  local_2c0 = 0;
  puVar20 = (uchar *)0x0;
  do {
    if (state->error != 0) break;
    pbVar16 = (byte *)((long)chunk + (0xc - (long)in));
    uVar14 = 0x1e;
    if ((insize < pbVar16) || (chunk < in)) {
LAB_0010c8e1:
      state->error = uVar14;
      break;
    }
    uVar23 = (uint)(byte)*chunk << 0x18;
    if ((int)uVar23 < 0) {
      uVar14 = 0x3f;
      goto LAB_0010c8e1;
    }
    uVar23 = (uint)*(byte *)((long)chunk + 3) | (uint)*(byte *)((long)chunk + 1) << 0x10 |
             (uint)*(byte *)((long)chunk + 2) << 8 | uVar23;
    uVar22 = (ulong)uVar23;
    if ((insize < pbVar16 + uVar22) || ((byte *)((long)chunk + uVar22 + 0xc) < in)) {
      uVar14 = 0x40;
      goto LAB_0010c8e1;
    }
    data = chunk + 2;
    uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"IDAT");
    puVar17 = puVar20;
    if (uVar12 == '\0') {
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"IEND");
      if (uVar12 != '\0') {
        bVar9 = true;
        bVar8 = false;
        goto LAB_0010c46a;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"PLTE");
      if (uVar12 != '\0') {
        puVar18 = (state->info_png).color.palette;
        if (puVar18 != (uchar *)0x0) {
          free(puVar18);
        }
        (state->info_png).color.palettesize = uVar22 / 3;
        puVar18 = (uchar *)malloc(uVar22 / 3 << 2);
        (state->info_png).color.palette = puVar18;
        if ((uVar23 < 3) || (puVar18 != (uchar *)0x0)) {
          if (uVar23 < 0x303) {
            iVar15 = 2;
            if (2 < uVar23) {
              uVar14 = 1;
              uVar22 = 3;
              iVar15 = 2;
              uVar23 = 2;
              do {
                iVar7 = (int)uVar22;
                (state->info_png).color.palette[iVar7 - 3] =
                     *(byte *)((long)data + (ulong)(uVar23 - 2));
                (state->info_png).color.palette[iVar7 - 2] =
                     *(byte *)((long)data + (ulong)(uVar23 - 1));
                (state->info_png).color.palette[iVar7 - 1] = *(byte *)((long)data + (ulong)uVar23);
                (state->info_png).color.palette[uVar22] = 0xff;
                uVar24 = (ulong)uVar14;
                uVar14 = uVar14 + 1;
                uVar22 = (ulong)(iVar7 + 4);
                uVar23 = uVar23 + 3;
              } while ((state->info_png).color.palettesize != uVar24);
            }
LAB_0010c722:
            state->error = 0;
            uVar24 = local_2c0;
            goto LAB_0010c465;
          }
LAB_0010c8ca:
          uVar14 = 0x26;
        }
        else {
          (state->info_png).color.palettesize = 0;
          uVar14 = 0x53;
        }
        goto LAB_0010c8e1;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"tRNS");
      if (uVar12 != '\0') {
        LVar1 = color_00->colortype;
        if (LVar1 == LCT_GREY) {
          if (uVar23 == 2) {
            (state->info_png).color.key_defined = 1;
            uVar13 = (ushort)chunk[2] << 8 | (ushort)chunk[2] >> 8;
            (state->info_png).color.key_b = (uint)uVar13;
            (state->info_png).color.key_g = (uint)uVar13;
            lVar27 = 0x1c;
LAB_0010c71a:
            *(uint *)((long)&color_00->colortype + lVar27) = (uint)uVar13;
            goto LAB_0010c722;
          }
        }
        else if (LVar1 == LCT_RGB) {
          if (uVar23 == 6) {
            (state->info_png).color.key_defined = 1;
            (state->info_png).color.key_r =
                 (uint)(ushort)((ushort)chunk[2] << 8 | (ushort)chunk[2] >> 8);
            (state->info_png).color.key_g =
                 (uint)(ushort)(*(ushort *)((long)chunk + 10) << 8 |
                               *(ushort *)((long)chunk + 10) >> 8);
            uVar13 = (ushort)chunk[3] << 8 | (ushort)chunk[3] >> 8;
            lVar27 = 0x24;
            goto LAB_0010c71a;
          }
          uVar14 = 0x29;
        }
        else {
          if (LVar1 == LCT_PALETTE) {
            if ((state->info_png).color.palettesize < uVar22) goto LAB_0010c8ca;
            if (uVar22 != 0) {
              uVar24 = 0;
              do {
                (state->info_png).color.palette[(uVar24 & 0xffffffff) + 3] = (byte)*data;
                uVar24 = uVar24 + 4;
                data = (uint *)((long)data + 1);
              } while (uVar22 << 2 != uVar24);
            }
            goto LAB_0010c722;
          }
          uVar14 = 0x2a;
        }
        goto LAB_0010c8e1;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"bKGD");
      if (uVar12 != '\0') {
        uVar14 = readChunk_bKGD(info,(uchar *)data,uVar22);
        goto LAB_0010c67b;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"tEXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_tEXt(info,(uchar *)data,uVar22);
LAB_0010c7cc:
          state->error = uVar14;
          if (uVar14 != 0) break;
        }
LAB_0010c7db:
        bVar8 = true;
        bVar9 = false;
        goto LAB_0010c46a;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"zTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_zTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar22);
          goto LAB_0010c7cc;
        }
        goto LAB_0010c7db;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"iTXt");
      if (uVar12 != '\0') {
        if ((state->decoder).read_text_chunks != 0) {
          uVar14 = readChunk_iTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar22);
          goto LAB_0010c7cc;
        }
        goto LAB_0010c7db;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"tIME");
      if (uVar12 != '\0') {
        uVar14 = readChunk_tIME(info,(uchar *)data,uVar22);
LAB_0010c67b:
        state->error = uVar14;
        if (uVar14 == 0) goto LAB_0010c7db;
        break;
      }
      uVar12 = lodepng_chunk_type_equals((uchar *)chunk,"pHYs");
      if (uVar12 != '\0') {
        uVar14 = readChunk_pHYs(info,(uchar *)data,uVar22);
        goto LAB_0010c67b;
      }
      if ((chunk[1] & 0x20) == 0) {
        uVar14 = 0x45;
        goto LAB_0010c8e1;
      }
      bVar10 = true;
      if ((state->decoder).remember_unknown_chunks != 0) {
        uVar14 = lodepng_chunk_append
                           (local_240 + (iVar15 - 1U),local_248 + (iVar15 - 1U),(uchar *)chunk);
        state->error = uVar14;
        if (uVar14 != 0) break;
      }
      bVar9 = false;
LAB_0010c4bd:
      uVar14 = *chunk;
      chunk = (uint *)((long)chunk +
                      (ulong)((uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                              uVar14 << 0x18) + 0xc));
    }
    else {
      uVar24 = local_2c0 + uVar22;
      if (uVar28 < uVar24) {
        uVar29 = uVar28 * 2;
        uVar28 = uVar24 * 3 >> 1;
        if (uVar29 < uVar24) {
          uVar28 = uVar24;
        }
        puVar17 = (uchar *)realloc(puVar20,uVar28);
        if (puVar17 == (uchar *)0x0) {
          uVar14 = 0x53;
          goto LAB_0010c8e1;
        }
      }
      iVar15 = 3;
      if (uVar22 != 0) {
        uVar29 = 0;
        do {
          puVar17[uVar29 + local_2c0] = *(byte *)((long)data + uVar29);
          uVar29 = uVar29 + 1;
        } while (uVar22 != uVar29);
      }
LAB_0010c465:
      local_2c0 = uVar24;
      bVar9 = false;
      bVar8 = true;
      puVar20 = puVar17;
LAB_0010c46a:
      if ((state->decoder).ignore_crc == 0 && !bVar10) {
        uVar14 = lodepng_chunk_check_crc((uchar *)chunk);
        bVar10 = false;
        if (uVar14 != 0) {
          uVar14 = 0x39;
          goto LAB_0010c8e1;
        }
      }
      if (bVar8) goto LAB_0010c4bd;
    }
  } while (!bVar9);
  local_268 = (uchar *)0x0;
  sStack_260 = 0;
  local_258 = 0;
  uVar14 = *w;
  if ((state->info_png).interlace_method == 0) {
    uVar23 = *h;
    sVar19 = lodepng_get_raw_size_idat
                       (uVar14,uVar23,(LodePNGColorMode *)(ulong)(state->info_png).color.colortype);
    __size = sVar19 + uVar23;
  }
  else {
    uVar23 = *h;
    uVar32 = uVar23 + 7 >> 3;
    LVar1 = (state->info_png).color.colortype;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 7 >> 3,uVar32,(LodePNGColorMode *)(ulong)LVar1);
    lVar27 = sVar19 + uVar32;
    if (4 < uVar14) {
      sVar19 = lodepng_get_raw_size_idat(uVar14 + 3 >> 3,uVar32,(LodePNGColorMode *)(ulong)LVar1);
      lVar27 = lVar27 + (ulong)uVar32 + sVar19;
    }
    uVar32 = uVar23 + 3 >> 3;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 3 >> 2,uVar32,(LodePNGColorMode *)(ulong)LVar1);
    lVar27 = uVar32 + sVar19 + lVar27;
    if (2 < uVar14) {
      uVar32 = uVar23 + 3 >> 2;
      sVar19 = lodepng_get_raw_size_idat(uVar14 + 1 >> 2,uVar32,(LodePNGColorMode *)(ulong)LVar1);
      lVar27 = lVar27 + uVar32 + sVar19;
    }
    uVar32 = uVar23 + 1 >> 2;
    sVar19 = lodepng_get_raw_size_idat(uVar14 + 1 >> 1,uVar32,(LodePNGColorMode *)(ulong)LVar1);
    lVar27 = uVar32 + sVar19 + lVar27;
    if (1 < uVar14) {
      uVar32 = uVar23 + 1 >> 1;
      sVar19 = lodepng_get_raw_size_idat(uVar14 >> 1,uVar32,(LodePNGColorMode *)(ulong)LVar1);
      lVar27 = lVar27 + uVar32 + sVar19;
    }
    sVar19 = lodepng_get_raw_size_idat(uVar14,uVar23 >> 1,(LodePNGColorMode *)(ulong)LVar1);
    __size = sVar19 + (uVar23 >> 1) + lVar27;
  }
  if (state->error == 0) {
    puVar17 = local_268;
    sVar11 = local_258;
    if ((__size == 0) ||
       (puVar17 = (uchar *)malloc(__size), sVar11 = __size, puVar17 != (uchar *)0x0)) {
      local_258 = sVar11;
      local_268 = puVar17;
      p_Var5 = (state->decoder).zlibsettings.custom_zlib;
      if (p_Var5 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                     *)0x0) {
        uVar14 = lodepng_zlib_decompress
                           (&local_268,&sStack_260,puVar20,local_2c0,&zlibsettings->zlibsettings);
      }
      else {
        uVar14 = (*p_Var5)(&local_268,&sStack_260,puVar20,local_2c0,&zlibsettings->zlibsettings);
      }
      uVar23 = 0x5b;
      if (sStack_260 == __size) {
        uVar23 = uVar14;
      }
      if (uVar14 != 0) {
        uVar23 = uVar14;
      }
    }
    else {
      uVar23 = 0x53;
    }
    state->error = uVar23;
  }
  free(puVar20);
  if (state->error != 0) goto LAB_0010cf28;
  uVar14 = *w;
  uVar23 = *h;
  sVar19 = lodepng_get_raw_size(uVar14,uVar23,color_00);
  puVar20 = (uchar *)malloc(sVar19);
  puVar17 = local_268;
  *out = puVar20;
  if (puVar20 == (uchar *)0x0) {
    uVar32 = 0x53;
  }
  else {
    if (sVar19 != 0) {
      sVar21 = 0;
      do {
        (*out)[sVar21] = '\0';
        sVar21 = sVar21 + 1;
      } while (sVar19 != sVar21);
      puVar20 = *out;
      uVar14 = *w;
      uVar23 = *h;
    }
    uVar28 = (ulong)(state->info_png).color.colortype;
    iVar15 = 0;
    if (uVar28 < 7) {
      iVar15 = *(int *)(&DAT_00113c24 + uVar28 * 4);
    }
    uVar31 = iVar15 * (state->info_png).color.bitdepth;
    if (uVar31 == 0) {
      uVar32 = 0x1f;
    }
    else {
      if ((state->info_png).interlace_method == 0) {
        if (uVar31 < 8) {
          uVar25 = uVar31 * uVar14;
          uVar26 = uVar25 + 7 & 0xfffffff8;
          if (uVar25 != uVar26) {
            uVar32 = unfilter(local_268,local_268,uVar14,uVar23,uVar31);
            if (uVar32 != 0) goto LAB_0010cf21;
            removePaddingBits(puVar20,puVar17,(ulong)uVar25,(ulong)uVar26,uVar23);
            goto LAB_0010cef1;
          }
        }
        uVar32 = unfilter(puVar20,local_268,uVar14,uVar23,uVar31);
        if (uVar32 != 0) goto LAB_0010cf21;
      }
      else {
        Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar14,uVar23,
                            uVar31);
        lVar27 = 0;
        do {
          lVar6 = *(long *)((long)padded_passstart + lVar27 * 2);
          uVar25 = *(uint *)((long)passw + lVar27);
          uVar26 = *(uint *)((long)passh + lVar27);
          uVar32 = unfilter(puVar17 + lVar6,puVar17 + *(long *)((long)filter_passstart + lVar27 * 2)
                            ,uVar25,uVar26,uVar31);
          if (uVar32 != 0) goto LAB_0010cf21;
          if (uVar31 < 8) {
            uVar25 = uVar25 * uVar31;
            removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar27 * 2),puVar17 + lVar6,
                              (ulong)uVar25,(ulong)(uVar25 + 7 & 0xfffffff8),uVar26);
          }
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x1c);
        Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,local_1b8,uVar14,
                            uVar23,uVar31);
        if (uVar31 < 8) {
          lVar27 = 0;
          do {
            uVar23 = passh_1[lVar27];
            if (uVar23 != 0) {
              uVar32 = passw_1[lVar27];
              uVar25 = 0;
              do {
                if ((ulong)uVar32 != 0) {
                  sVar19 = local_1b8[lVar27];
                  uVar26 = ADAM7_DY[lVar27];
                  uVar2 = ADAM7_IY[lVar27];
                  uVar3 = ADAM7_DX[lVar27];
                  uVar4 = ADAM7_IX[lVar27];
                  uVar28 = 0;
                  do {
                    uVar24 = (ulong)((uVar3 * (int)uVar28 +
                                     (uVar26 * uVar25 + uVar2) * uVar14 + uVar4) * uVar31);
                    uVar22 = (ulong)((uVar25 * uVar32 + (int)uVar28) * uVar31) + sVar19 * 8;
                    uVar30 = uVar31;
                    do {
                      if ((puVar17[uVar22 >> 3] >> (~(byte)uVar22 & 7) & 1) != 0) {
                        puVar20[uVar24 >> 3] = puVar20[uVar24 >> 3] | '\x01' << (~(byte)uVar24 & 7);
                      }
                      uVar24 = uVar24 + 1;
                      uVar22 = uVar22 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                    uVar28 = uVar28 + 1;
                  } while (uVar28 != uVar32);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar23);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 7);
        }
        else {
          uVar28 = (ulong)(uVar31 >> 3);
          lVar27 = 0;
          do {
            uVar23 = passh_1[lVar27];
            if (uVar23 != 0) {
              uVar32 = passw_1[lVar27];
              uVar22 = 0;
              uVar31 = 0;
              do {
                iVar15 = (int)uVar22;
                if ((ulong)uVar32 != 0) {
                  uVar25 = ADAM7_DX[lVar27];
                  uVar26 = (ADAM7_DY[lVar27] * uVar31 + ADAM7_IY[lVar27]) * uVar14 +
                           ADAM7_IX[lVar27];
                  sVar19 = local_1b8[lVar27];
                  uVar24 = 0;
                  do {
                    uVar29 = 0;
                    do {
                      puVar20[uVar29 + uVar26 * uVar28] = puVar17[uVar29 + uVar22 * uVar28 + sVar19]
                      ;
                      uVar29 = uVar29 + 1;
                    } while (uVar28 != uVar29);
                    uVar24 = uVar24 + 1;
                    uVar26 = uVar26 + uVar25;
                    uVar22 = (ulong)((int)uVar22 + 1);
                  } while (uVar24 != uVar32);
                }
                uVar31 = uVar31 + 1;
                uVar22 = (ulong)(iVar15 + uVar32);
              } while (uVar31 != uVar23);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != 7);
        }
      }
LAB_0010cef1:
      uVar32 = 0;
    }
  }
LAB_0010cf21:
  state->error = uVar32;
LAB_0010cf28:
  sStack_260 = 0;
  local_258 = 0;
  free(local_268);
  if (state->error != 0) {
    return state->error;
  }
  dest = &state->info_raw;
  if ((state->decoder).color_convert == 0) {
    uVar14 = lodepng_color_mode_copy(dest,color_00);
    state->error = uVar14;
    return uVar14;
  }
  iVar15 = lodepng_color_mode_equal(dest,color_00);
  if (iVar15 != 0) {
    return 0;
  }
  puVar20 = *out;
  if (((dest->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
    return 0x38;
  }
  uVar14 = *w;
  uVar23 = *h;
  sVar19 = lodepng_get_raw_size(uVar14,uVar23,dest);
  puVar17 = (uchar *)malloc(sVar19);
  *out = puVar17;
  if (puVar17 == (uchar *)0x0) {
    uVar14 = 0x53;
  }
  else {
    uVar14 = lodepng_convert(puVar17,puVar20,dest,color_00,uVar14,uVar23);
  }
  state->error = uVar14;
  free(puVar20);
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}